

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_transfer.cpp
# Opt level: O3

void Omega_h::transfer_face_flux
               (Mesh *old_mesh,Mesh *new_mesh,LOs *same_ents2old_ents,LOs *same_ents2new_ents,
               LOs *prods2new_ents)

{
  int *piVar1;
  Alloc *pAVar2;
  Int IVar3;
  int iVar4;
  TagBase *this;
  string *psVar5;
  int i;
  size_t sVar6;
  Read<double> local_b8;
  LOs local_a8;
  LOs local_98;
  LOs local_88;
  Read<double> prod_data;
  string local_68;
  Mesh *local_48;
  Read<double> old_data;
  
  local_48 = new_mesh;
  IVar3 = Mesh::ntags(old_mesh,2);
  if (0 < IVar3) {
    i = 0;
    do {
      this = Mesh::get_tag(old_mesh,2,i);
      psVar5 = TagBase::name_abi_cxx11_(this);
      iVar4 = std::__cxx11::string::compare((char *)psVar5);
      if (iVar4 == 0) {
        TagBase::name_abi_cxx11_(this);
        Mesh::get_array<double>((Mesh *)&old_data,(Int)old_mesh,(string *)0x2);
        pAVar2 = (prods2new_ents->write_).shared_alloc_.alloc;
        if (((ulong)pAVar2 & 1) == 0) {
          sVar6 = pAVar2->size;
        }
        else {
          sVar6 = (ulong)pAVar2 >> 3;
        }
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"");
        Read<double>::Read(&prod_data,(LO)(sVar6 >> 2),0.0,&local_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
        local_88.write_.shared_alloc_.alloc = (same_ents2old_ents->write_).shared_alloc_.alloc;
        if (((ulong)local_88.write_.shared_alloc_.alloc & 7) == 0 &&
            local_88.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_88.write_.shared_alloc_.alloc =
                 (Alloc *)((local_88.write_.shared_alloc_.alloc)->size * 8 + 1);
          }
          else {
            (local_88.write_.shared_alloc_.alloc)->use_count =
                 (local_88.write_.shared_alloc_.alloc)->use_count + 1;
          }
        }
        local_88.write_.shared_alloc_.direct_ptr =
             (same_ents2old_ents->write_).shared_alloc_.direct_ptr;
        local_98.write_.shared_alloc_.alloc = (same_ents2new_ents->write_).shared_alloc_.alloc;
        if (((ulong)local_98.write_.shared_alloc_.alloc & 7) == 0 &&
            local_98.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_98.write_.shared_alloc_.alloc =
                 (Alloc *)((local_98.write_.shared_alloc_.alloc)->size * 8 + 1);
          }
          else {
            (local_98.write_.shared_alloc_.alloc)->use_count =
                 (local_98.write_.shared_alloc_.alloc)->use_count + 1;
          }
        }
        local_98.write_.shared_alloc_.direct_ptr =
             (same_ents2new_ents->write_).shared_alloc_.direct_ptr;
        local_a8.write_.shared_alloc_.alloc = (prods2new_ents->write_).shared_alloc_.alloc;
        if (((ulong)local_a8.write_.shared_alloc_.alloc & 7) == 0 &&
            local_a8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_a8.write_.shared_alloc_.alloc =
                 (Alloc *)((local_a8.write_.shared_alloc_.alloc)->size * 8 + 1);
          }
          else {
            (local_a8.write_.shared_alloc_.alloc)->use_count =
                 (local_a8.write_.shared_alloc_.alloc)->use_count + 1;
          }
        }
        local_a8.write_.shared_alloc_.direct_ptr = (prods2new_ents->write_).shared_alloc_.direct_ptr
        ;
        local_b8.write_.shared_alloc_.alloc = prod_data.write_.shared_alloc_.alloc;
        if (((ulong)prod_data.write_.shared_alloc_.alloc & 7) == 0 &&
            prod_data.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_b8.write_.shared_alloc_.alloc =
                 (Alloc *)((prod_data.write_.shared_alloc_.alloc)->size * 8 + 1);
          }
          else {
            (prod_data.write_.shared_alloc_.alloc)->use_count =
                 (prod_data.write_.shared_alloc_.alloc)->use_count + 1;
          }
        }
        local_b8.write_.shared_alloc_.direct_ptr = prod_data.write_.shared_alloc_.direct_ptr;
        transfer_common<double>(old_mesh,local_48,2,&local_88,&local_98,&local_a8,this,&local_b8);
        pAVar2 = local_b8.write_.shared_alloc_.alloc;
        if (((ulong)local_b8.write_.shared_alloc_.alloc & 7) == 0 &&
            local_b8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          piVar1 = &(local_b8.write_.shared_alloc_.alloc)->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_b8.write_.shared_alloc_.alloc);
            operator_delete(pAVar2,0x48);
          }
        }
        pAVar2 = local_a8.write_.shared_alloc_.alloc;
        if (((ulong)local_a8.write_.shared_alloc_.alloc & 7) == 0 &&
            local_a8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          piVar1 = &(local_a8.write_.shared_alloc_.alloc)->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_a8.write_.shared_alloc_.alloc);
            operator_delete(pAVar2,0x48);
          }
        }
        pAVar2 = local_98.write_.shared_alloc_.alloc;
        if (((ulong)local_98.write_.shared_alloc_.alloc & 7) == 0 &&
            local_98.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          piVar1 = &(local_98.write_.shared_alloc_.alloc)->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_98.write_.shared_alloc_.alloc);
            operator_delete(pAVar2,0x48);
          }
        }
        pAVar2 = local_88.write_.shared_alloc_.alloc;
        if (((ulong)local_88.write_.shared_alloc_.alloc & 7) == 0 &&
            local_88.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          piVar1 = &(local_88.write_.shared_alloc_.alloc)->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_88.write_.shared_alloc_.alloc);
            operator_delete(pAVar2,0x48);
          }
        }
        pAVar2 = prod_data.write_.shared_alloc_.alloc;
        if (((ulong)prod_data.write_.shared_alloc_.alloc & 7) == 0 &&
            prod_data.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          piVar1 = &(prod_data.write_.shared_alloc_.alloc)->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(prod_data.write_.shared_alloc_.alloc);
            operator_delete(pAVar2,0x48);
          }
        }
        pAVar2 = old_data.write_.shared_alloc_.alloc;
        if (((ulong)old_data.write_.shared_alloc_.alloc & 7) == 0 &&
            old_data.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          piVar1 = &(old_data.write_.shared_alloc_.alloc)->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(old_data.write_.shared_alloc_.alloc);
            operator_delete(pAVar2,0x48);
          }
        }
      }
      i = i + 1;
      IVar3 = Mesh::ntags(old_mesh,2);
    } while (i < IVar3);
  }
  return;
}

Assistant:

static void transfer_face_flux(Mesh* old_mesh, Mesh* new_mesh,
    LOs same_ents2old_ents, LOs same_ents2new_ents, LOs prods2new_ents) {
  for (Int i = 0; i < old_mesh->ntags(FACE); ++i) {
    TagBase const* tagbase = old_mesh->get_tag(FACE, i);
    if (tagbase->name() == "magnetic face flux") {
      Read<Real> old_data = old_mesh->get_array<Real>(FACE, tagbase->name());
      Read<Real> prod_data(prods2new_ents.size(), 0);
      transfer_common(old_mesh, new_mesh, FACE, same_ents2old_ents,
          same_ents2new_ents, prods2new_ents, tagbase, prod_data);
    }
  }
}